

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::FboTestUtil::Texture2DShader::shadeFragments
          (Texture2DShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  DataType DVar1;
  deUint32 dVar2;
  pointer pUVar3;
  GenericVec4 *pGVar4;
  FragmentShadingContext *context_00;
  int i_3;
  int iVar5;
  undefined8 *puVar6;
  rr *prVar7;
  long lVar8;
  undefined8 *puVar9;
  int fragNdx;
  long lVar10;
  long lVar11;
  FragmentPacket *packet;
  int fragNdx_2;
  int iVar12;
  Vec4 scale;
  Vec4 bias;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  Vec4 coord;
  Vec2 texCoords [4];
  Vec4 outBias;
  Vec4 outScale;
  Vec4 colors [4];
  undefined8 local_168;
  undefined8 uStack_160;
  FragmentShadingContext *local_158;
  long local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  ulong local_130;
  ulong local_128;
  FragmentPacket *local_120;
  float local_118 [8];
  Vec2 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  Vec2 local_b8 [4];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78 [9];
  
  pUVar3 = (this->super_ShaderProgram).m_uniforms.
           super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_88 = *(undefined8 *)&pUVar3->value;
  uStack_80 = *(undefined8 *)((long)&pUVar3->value + 8);
  local_98 = *(undefined8 *)&pUVar3[1].value;
  uStack_90 = *(undefined8 *)((long)&pUVar3[1].value + 8);
  local_b8[2].m_data[0] = 0.0;
  local_b8[2].m_data[1] = 0.0;
  local_b8[3].m_data[0] = 0.0;
  local_b8[3].m_data[1] = 0.0;
  local_b8[0].m_data[0] = 0.0;
  local_b8[0].m_data[1] = 0.0;
  local_b8[1].m_data[0] = 0.0;
  local_b8[1].m_data[1] = 0.0;
  local_78[6] = 0;
  local_78[7] = 0;
  local_78[4] = 0;
  local_78[5] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  if (0 < numPackets) {
    local_128 = (ulong)(uint)numPackets;
    local_130 = 0;
    local_158 = context;
    local_120 = packets;
    do {
      context_00 = local_158;
      packet = local_120 + local_130;
      lVar10 = 0;
      do {
        rr::readTriangleVarying<float>((rr *)&local_f8,packet,context_00,0,(int)lVar10);
        *&local_b8[lVar10].m_data = local_f8.m_data;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      lVar10 = 0;
      do {
        *(undefined8 *)((long)local_78 + lVar10) = 0;
        *(undefined8 *)((long)local_78 + lVar10 + 8) = 0;
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x40);
      puVar9 = local_78;
      if (0 < (int)((ulong)((long)(this->m_inputs).
                                  super__Vector_base<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_inputs).
                                 super__Vector_base<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 2) * 0x38e38e39) {
        lVar10 = 0;
        do {
          iVar5 = (int)lVar10;
          pUVar3 = (this->super_ShaderProgram).m_uniforms.
                   super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl
                   .super__Vector_impl_data._M_start;
          local_168 = *(undefined8 *)&pUVar3[iVar5 * 3 + 3].value;
          uStack_160 = *(undefined8 *)((long)&pUVar3[iVar5 * 3 + 3].value + 8);
          local_148 = *(undefined8 *)&pUVar3[iVar5 * 3 + 4].value;
          uStack_140 = *(undefined8 *)((long)&pUVar3[iVar5 * 3 + 4].value + 8);
          local_c8 = 0;
          uStack_c0 = 0;
          local_d8 = 0;
          uStack_d0 = 0;
          local_e8 = 0;
          uStack_e0 = 0;
          local_f8.m_data[0] = 0.0;
          local_f8.m_data[1] = 0.0;
          uStack_f0 = 0;
          sglr::rc::Texture2D::sample4
                    (pUVar3[iVar5 * 3 + 2].sampler.tex2D,(Vec4 *)&local_f8,local_b8,0.0);
          lVar8 = 0;
          puVar6 = puVar9;
          prVar7 = (rr *)&local_f8;
          do {
            local_118[0] = 0.0;
            local_118[1] = 0.0;
            local_118[2] = 0.0;
            local_118[3] = 0.0;
            lVar11 = 0;
            do {
              local_118[lVar11] =
                   *(float *)(prVar7 + lVar11 * 4) * *(float *)((long)&local_168 + lVar11 * 4);
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            local_118[4] = 0.0;
            local_118[5] = 0.0;
            local_118[6] = 0.0;
            local_118[7] = 0.0;
            lVar11 = 0;
            do {
              local_118[lVar11 + 4] = local_118[lVar11] + *(float *)((long)&local_148 + lVar11 * 4);
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            lVar11 = 0;
            do {
              *(float *)((long)puVar6 + lVar11 * 4) =
                   local_118[lVar11 + 4] + *(float *)((long)puVar6 + lVar11 * 4);
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            lVar8 = lVar8 + 1;
            prVar7 = prVar7 + 0x10;
            puVar6 = puVar6 + 2;
          } while (lVar8 != 4);
          lVar10 = lVar10 + 1;
        } while (lVar10 < (int)((ulong)((long)(this->m_inputs).
                                              super__Vector_base<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->m_inputs).
                                             super__Vector_base<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                          0x38e38e39);
      }
      DVar1 = this->m_outputType;
      pGVar4 = context_00->outputArray;
      local_150 = local_130 * 4;
      lVar10 = 0;
      do {
        local_168 = 0;
        uStack_160 = 0;
        lVar8 = 0;
        do {
          *(float *)((long)&local_168 + lVar8 * 4) =
               *(float *)((long)puVar9 + lVar8 * 4) * *(float *)((long)&local_88 + lVar8 * 4);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        local_f8.m_data[0] = 0.0;
        local_f8.m_data[1] = 0.0;
        uStack_f0 = 0;
        lVar8 = 0;
        do {
          local_f8.m_data[lVar8] =
               *(float *)((long)&local_168 + lVar8 * 4) + *(float *)((long)&local_98 + lVar8 * 4);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        castVectorSaturate<int>((Vec4 *)&local_f8);
        castVectorSaturate<unsigned_int>((Vec4 *)&local_f8);
        iVar12 = (int)lVar10;
        iVar5 = (int)local_150;
        if (DVar1 == TYPE_UINT_VEC4) {
          lVar8 = (long)((iVar5 + iVar12) * local_158->numFragmentOutputs);
          pGVar4[lVar8].v.uData[0] = (deUint32)local_148;
          pGVar4[lVar8].v.uData[1] = local_148._4_4_;
          pGVar4[lVar8].v.uData[2] = (deUint32)uStack_140;
          dVar2 = uStack_140._4_4_;
LAB_01506a09:
          pGVar4[lVar8].v.uData[3] = dVar2;
        }
        else {
          if (DVar1 == TYPE_INT_VEC4) {
            lVar8 = (long)((iVar5 + iVar12) * local_158->numFragmentOutputs);
            pGVar4[lVar8].v.uData[0] = (deUint32)local_168;
            pGVar4[lVar8].v.uData[1] = local_168._4_4_;
            pGVar4[lVar8].v.uData[2] = (deUint32)uStack_160;
            dVar2 = uStack_160._4_4_;
            goto LAB_01506a09;
          }
          if (DVar1 == TYPE_FLOAT_VEC4) {
            iVar5 = (iVar5 + iVar12) * local_158->numFragmentOutputs;
            pGVar4[iVar5].v.uData[0] = (deUint32)local_f8.m_data[0];
            pGVar4[iVar5].v.uData[1] = (deUint32)local_f8.m_data[1];
            pGVar4[iVar5].v.uData[2] = (deUint32)uStack_f0;
            pGVar4[iVar5].v.uData[3] = uStack_f0._4_4_;
          }
        }
        lVar10 = lVar10 + 1;
        puVar9 = puVar9 + 2;
      } while (lVar10 != 4);
      local_130 = local_130 + 1;
    } while (local_130 != local_128);
  }
  return;
}

Assistant:

void Texture2DShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4 outScale (m_uniforms[0].value.f4);
	const tcu::Vec4 outBias	 (m_uniforms[1].value.f4);

	tcu::Vec2 texCoords[4];
	tcu::Vec4 colors[4];

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		// setup tex coords
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4	coord = rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
			texCoords[fragNdx] = tcu::Vec2(coord.x(), coord.y());
		}

		// clear result
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			colors[fragNdx] = tcu::Vec4(0.0f);

		// sample each texture
		for (int ndx = 0; ndx < (int)m_inputs.size(); ndx++)
		{
			const sglr::rc::Texture2D*	tex		= m_uniforms[2 + ndx*3].sampler.tex2D;
			const tcu::Vec4				scale	(m_uniforms[2 + ndx*3 + 1].value.f4);
			const tcu::Vec4				bias	(m_uniforms[2 + ndx*3 + 2].value.f4);
			tcu::Vec4 tmpColors[4];

			tex->sample4(tmpColors, texCoords);

			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
				colors[fragNdx] += tmpColors[fragNdx] * scale + bias;
		}

		// write out
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4		color	= colors[fragNdx] * outScale + outBias;
			const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
			const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

			if (m_outputType == glu::TYPE_FLOAT_VEC4)			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
			else if (m_outputType == glu::TYPE_INT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
			else if (m_outputType == glu::TYPE_UINT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
			else
				DE_ASSERT(DE_FALSE);
		}
	}
}